

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftcep.cc
# Opt level: O2

int main(int argc,char **argv)

{
  InputOutputFormats IVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  ifstream *input_stream;
  long lVar8;
  allocator local_7e1;
  int fft_length;
  int num_order;
  InputOutputFormats local_7d8;
  int num_iteration;
  string local_7d0;
  double relative_floor_in_decibels;
  double epsilon;
  double acceleration_factor;
  ostringstream error_message_10;
  vector<double,_std::allocator<double>_> input;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  FastFourierTransformCepstralAnalysis analysis;
  ifstream ifs;
  byte abStack_4c0 [488];
  Buffer buffer_for_cepstral_analysis;
  SpectrumToSpectrum spectrum_to_spectrum;
  WaveformToSpectrum waveform_to_spectrum;
  Buffer buffer_for_spectral_analysis;
  
  fft_length = 0x100;
  num_order = 0x19;
  num_iteration = 0;
  acceleration_factor = 0.0;
  epsilon = 0.0;
  relative_floor_in_decibels = -1.79769313486232e+308;
  IVar1 = kNumInputOutputFormats;
  do {
    local_7d8 = IVar1;
    iVar5 = ya_getopt_long(argc,argv,"l:m:i:a:q:e:E:h",(option *)0x0,(int *)0x0);
    IVar1 = local_7d8;
    switch(iVar5) {
    case 0x61:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&acceleration_factor);
      bVar3 = acceleration_factor < 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      IVar1 = local_7d8;
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -a option must be a ");
        std::operator<<(poVar6,"non-negative number");
        std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
        goto LAB_001040d5;
      }
      break;
    case 0x62:
    case 99:
    case 100:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
switchD_0010371f_caseD_62:
      anon_unknown.dwarf_2b1c::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x65:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&epsilon);
      bVar3 = epsilon <= 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      IVar1 = local_7d8;
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -e option must be a positive number");
        std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
        goto LAB_001040d5;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_2b1c::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&num_iteration);
      bVar2 = num_iteration < 0;
      std::__cxx11::string::~string((string *)&ifs);
      IVar1 = local_7d8;
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -i option must be a ");
        std::operator<<(poVar6,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
        goto LAB_001040d5;
      }
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&fft_length);
      std::__cxx11::string::~string((string *)&ifs);
      IVar1 = local_7d8;
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be an integer");
        std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
        goto LAB_001040d5;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
      bVar2 = num_order < 0;
      std::__cxx11::string::~string((string *)&ifs);
      IVar1 = local_7d8;
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
        std::operator<<(poVar6,"non-negative integer");
        std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
        goto LAB_001040d5;
      }
      break;
    case 0x71:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&analysis);
      if (bVar3) {
        bVar3 = sptk::IsInRange((InputOutputFormats)
                                analysis._vptr_FastFourierTransformCepstralAnalysis,0,4);
        std::__cxx11::string::~string((string *)&ifs);
        IVar1 = (InputOutputFormats)analysis._vptr_FastFourierTransformCepstralAnalysis;
        if (bVar3) break;
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -q option must be an integer ")
      ;
      poVar6 = std::operator<<(poVar6,"in the range of ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0);
      poVar6 = std::operator<<(poVar6," to ");
      std::ostream::operator<<((ostream *)poVar6,4);
      std::__cxx11::string::string
                ((string *)&error_message_10,"fftcep",(allocator *)&waveform_to_spectrum);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_001040d5;
    default:
      if (iVar5 != 0x45) {
        if (iVar5 != -1) goto switchD_0010371f_caseD_62;
        iVar5 = fft_length / 2;
        if (iVar5 < num_order) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar6 = std::operator<<((ostream *)&ifs,"Order of cepstrum ");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,num_order);
          poVar6 = std::operator<<(poVar6," must be equal to or less than half of FFT length ");
          std::ostream::operator<<((ostream *)poVar6,iVar5);
          std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
          sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
          goto LAB_001040d5;
        }
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Too many input files");
          std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
          sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
          goto LAB_001040d5;
        }
        if (argc == ya_optind) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = argv[ya_optind];
        }
        bVar3 = sptk::SetBinaryMode();
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Cannot set translation mode");
          std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
          sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
          goto LAB_001040d5;
        }
        input_stream = &ifs;
        std::ifstream::ifstream(input_stream);
        if ((pcVar7 != (char *)0x0) &&
           (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar7),
           (abStack_4c0[*(long *)(_ifs + -0x18)] & 5) != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
          poVar6 = std::operator<<((ostream *)&error_message_10,"Cannot open file ");
          std::operator<<(poVar6,pcVar7);
          std::__cxx11::string::string
                    ((string *)&analysis,"fftcep",(allocator *)&waveform_to_spectrum);
          sptk::PrintErrorMessage((string *)&analysis,&error_message_10);
          std::__cxx11::string::~string((string *)&analysis);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
          iVar5 = 1;
          goto LAB_0010437f;
        }
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          input_stream = (ifstream *)&std::cin;
        }
        sptk::SpectrumToSpectrum::SpectrumToSpectrum
                  (&spectrum_to_spectrum,fft_length,IVar1,kPowerSpectrum,epsilon,
                   relative_floor_in_decibels);
        if ((IVar1 != kNumInputOutputFormats) && (spectrum_to_spectrum.is_valid_ == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
          std::operator<<((ostream *)&error_message_10,"Failed to initialize SpectrumToSpectrum");
          std::__cxx11::string::string
                    ((string *)&analysis,"fftcep",(allocator *)&waveform_to_spectrum);
          sptk::PrintErrorMessage((string *)&analysis,&error_message_10);
          std::__cxx11::string::~string((string *)&analysis);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
          iVar5 = 1;
          goto LAB_00104372;
        }
        sptk::WaveformToSpectrum::WaveformToSpectrum
                  (&waveform_to_spectrum,fft_length,fft_length,kPowerSpectrum,epsilon,
                   relative_floor_in_decibels);
        buffer_for_spectral_analysis._vptr_Buffer = (_func_int **)&PTR__Buffer_001156f0;
        buffer_for_spectral_analysis.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00115720;
        buffer_for_spectral_analysis.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
             (_func_int **)&PTR__Buffer_00115750;
        memset(&buffer_for_spectral_analysis.buffer_.fast_fourier_transform_buffer_.real_part_input_
               ,0,0xa8);
        if ((IVar1 == kNumInputOutputFormats) &&
           (waveform_to_spectrum.filter_coefficients_to_spectrum_.is_valid_ == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
          std::operator<<((ostream *)&error_message_10,"Failed to initialize WaveformToSpectrum");
          std::__cxx11::string::string
                    ((string *)&analysis,"fftcep",(allocator *)&buffer_for_cepstral_analysis);
          sptk::PrintErrorMessage((string *)&analysis,&error_message_10);
          std::__cxx11::string::~string((string *)&analysis);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
          iVar5 = 1;
          goto LAB_00104358;
        }
        sptk::FastFourierTransformCepstralAnalysis::FastFourierTransformCepstralAnalysis
                  (&analysis,fft_length,num_order,num_iteration,acceleration_factor);
        buffer_for_cepstral_analysis._vptr_Buffer = (_func_int **)&PTR__Buffer_00115780;
        buffer_for_cepstral_analysis.real_part_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        buffer_for_cepstral_analysis.real_part_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        buffer_for_cepstral_analysis.real_part_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        buffer_for_cepstral_analysis.imag_part_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        buffer_for_cepstral_analysis.imag_part_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        buffer_for_cepstral_analysis.imag_part_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_fast_fourier_transform_._vptr_Buffer =
             (_func_int **)&PTR__Buffer_00115750;
        buffer_for_cepstral_analysis.buffer_for_fast_fourier_transform_.real_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_fast_fourier_transform_.real_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_fast_fourier_transform_.real_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_fast_fourier_transform_.imag_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_fast_fourier_transform_.imag_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_fast_fourier_transform_.imag_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_inverse_fast_fourier_transform_._vptr_Buffer =
             (_func_int **)&PTR__Buffer_001157b0;
        buffer_for_cepstral_analysis.buffer_for_inverse_fast_fourier_transform_.
        fast_fourier_transform_buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00115750;
        buffer_for_cepstral_analysis.buffer_for_inverse_fast_fourier_transform_.
        fast_fourier_transform_buffer_.real_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_inverse_fast_fourier_transform_.
        fast_fourier_transform_buffer_.real_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_inverse_fast_fourier_transform_.
        fast_fourier_transform_buffer_.real_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_inverse_fast_fourier_transform_.
        fast_fourier_transform_buffer_.imag_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_inverse_fast_fourier_transform_.
        fast_fourier_transform_buffer_.imag_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        buffer_for_cepstral_analysis.buffer_for_inverse_fast_fourier_transform_.
        fast_fourier_transform_buffer_.imag_part_input_.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if (analysis.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
          std::operator<<((ostream *)&error_message_10,
                          "Failed to initialize FastFourierTransformCepstralAnalysis");
          std::__cxx11::string::string((string *)&local_7d0,"fftcep",(allocator *)&input);
          sptk::PrintErrorMessage(&local_7d0,&error_message_10);
          std::__cxx11::string::~string((string *)&local_7d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
          iVar5 = 1;
          goto LAB_0010433e;
        }
        iVar5 = fft_length;
        if (IVar1 != kNumInputOutputFormats) {
          iVar5 = fft_length / 2 + 1;
        }
        lVar8 = (long)num_order;
        std::vector<double,_std::allocator<double>_>::vector
                  (&input,(long)iVar5,(allocator_type *)&error_message_10);
        std::vector<double,_std::allocator<double>_>::vector
                  (&processed_input,(long)(fft_length / 2 + 1),(allocator_type *)&error_message_10);
        std::vector<double,_std::allocator<double>_>::vector
                  (&output,lVar8 + 1U,(allocator_type *)&error_message_10);
        goto LAB_00103f5e;
      }
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&relative_floor_in_decibels);
      bVar3 = 0.0 <= relative_floor_in_decibels;
      std::__cxx11::string::~string((string *)&ifs);
      IVar1 = local_7d8;
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -E option must be a negative number");
        std::__cxx11::string::string((string *)&error_message_10,"fftcep",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
LAB_001040d5:
        std::__cxx11::string::~string((string *)&error_message_10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
  } while( true );
LAB_00103f5e:
  do {
    bVar3 = sptk::ReadStream<double>(false,0,0,iVar5,&input,(istream *)input_stream,(int *)0x0);
    if (!bVar3) {
      iVar5 = 0;
      goto LAB_00104317;
    }
    if (local_7d8 == kNumInputOutputFormats) {
      bVar3 = sptk::WaveformToSpectrum::Run
                        (&waveform_to_spectrum,&input,&processed_input,&buffer_for_spectral_analysis
                        );
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
        std::operator<<((ostream *)&error_message_10,"Failed to transform waveform to spectrum");
        std::__cxx11::string::string((string *)&local_7d0,"fftcep",&local_7e1);
        sptk::PrintErrorMessage(&local_7d0,&error_message_10);
        goto LAB_00104300;
      }
    }
    else {
      bVar3 = sptk::SpectrumToSpectrum::Run(&spectrum_to_spectrum,&input,&processed_input);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
        std::operator<<((ostream *)&error_message_10,"Failed to convert spectrum");
        std::__cxx11::string::string((string *)&local_7d0,"fftcep",&local_7e1);
        sptk::PrintErrorMessage(&local_7d0,&error_message_10);
        goto LAB_00104300;
      }
    }
    bVar3 = sptk::FastFourierTransformCepstralAnalysis::Run
                      (&analysis,&processed_input,&output,&buffer_for_cepstral_analysis);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
      std::operator<<((ostream *)&error_message_10,"Failed to run FFT cepstral analysis");
      std::__cxx11::string::string((string *)&local_7d0,"fftcep",&local_7e1);
      sptk::PrintErrorMessage(&local_7d0,&error_message_10);
      goto LAB_00104300;
    }
    bVar3 = sptk::WriteStream<double>(0,(int)(lVar8 + 1U),&output,(ostream *)&std::cout,(int *)0x0);
  } while (bVar3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
  std::operator<<((ostream *)&error_message_10,"Failed to write FFT cepstrum");
  std::__cxx11::string::string((string *)&local_7d0,"fftcep",&local_7e1);
  sptk::PrintErrorMessage(&local_7d0,&error_message_10);
LAB_00104300:
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
  iVar5 = 1;
LAB_00104317:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&processed_input.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input.super__Vector_base<double,_std::allocator<double>_>);
LAB_0010433e:
  sptk::FastFourierTransformCepstralAnalysis::Buffer::~Buffer(&buffer_for_cepstral_analysis);
  sptk::FastFourierTransformCepstralAnalysis::~FastFourierTransformCepstralAnalysis(&analysis);
LAB_00104358:
  sptk::WaveformToSpectrum::Buffer::~Buffer(&buffer_for_spectral_analysis);
  sptk::WaveformToSpectrum::~WaveformToSpectrum(&waveform_to_spectrum);
LAB_00104372:
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&spectrum_to_spectrum);
LAB_0010437f:
  std::ifstream::~ifstream(&ifs);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_order(kDefaultNumOrder);
  int num_iteration(kDefaultNumIteration);
  double acceleration_factor(kDefaultAccelerationFactor);
  InputFormats input_format(kDefaultInputFormat);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:i:a:q:e:E:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &acceleration_factor) ||
            acceleration_factor < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int half_fft_length(fft_length / 2);
  if (half_fft_length < num_order) {
    std::ostringstream error_message;
    error_message << "Order of cepstrum " << num_order
                  << " must be equal to or less than half of FFT length "
                  << half_fft_length;
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize SpectrumToSpectrum";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize WaveformToSpectrum";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  sptk::FastFourierTransformCepstralAnalysis analysis(
      fft_length, num_order, num_iteration, acceleration_factor);
  sptk::FastFourierTransformCepstralAnalysis::Buffer
      buffer_for_cepstral_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize FastFourierTransformCepstralAnalysis";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order + 1);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform == input_format) {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("fftcep", error_message);
        return 1;
      }
    } else {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("fftcep", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      &buffer_for_cepstral_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run FFT cepstral analysis";
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write FFT cepstrum";
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }
  }

  return 0;
}